

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_4c7ec0::StandardLevelComputer::StandardLevelComputer
          (StandardLevelComputer *this,string *lang,vector<int,_std::allocator<int>_> *levels,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *levelsStr)

{
  size_type sVar1;
  size_type sVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *levelsStr_local;
  vector<int,_std::allocator<int>_> *levels_local;
  string *lang_local;
  StandardLevelComputer *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)lang);
  std::vector<int,_std::allocator<int>_>::vector(&this->Levels,levels);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->LevelsAsStrings,levelsStr);
  sVar1 = std::vector<int,_std::allocator<int>_>::size(&this->Levels);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->LevelsAsStrings);
  if (sVar1 == sVar2) {
    return;
  }
  __assert_fail("this->Levels.size() == this->LevelsAsStrings.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmStandardLevelResolver.cxx"
                ,0x46,
                "(anonymous namespace)::StandardLevelComputer::StandardLevelComputer(std::string, std::vector<int>, std::vector<std::string>)"
               );
}

Assistant:

explicit StandardLevelComputer(std::string lang, std::vector<int> levels,
                                 std::vector<std::string> levelsStr)
    : Language(std::move(lang))
    , Levels(std::move(levels))
    , LevelsAsStrings(std::move(levelsStr))
  {
    assert(this->Levels.size() == this->LevelsAsStrings.size());
  }